

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_noncentral_absolute_pose_sac.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  MultiNoncentralAbsolutePoseSacProblem *this;
  ostream *poVar3;
  long *plVar4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  timeval tVar21;
  timeval tVar22;
  shared_ptr<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
  absposeproblem_ptr;
  rotations_t camRotations;
  translations_t camOffsets;
  timeval tic;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiBearingVectors;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiPoints;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  gt;
  timeval toc;
  translation_t position;
  rotation_t rotation;
  NoncentralAbsoluteMultiAdapter adapter;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  rotations_t local_360;
  translations_t local_340;
  timeval local_320;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_310;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_2f0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_2d0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_2b8;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_2a0;
  timeval local_288;
  Vector3d local_278;
  undefined1 local_260 [128];
  pointer local_1e0;
  pointer pvStack_1d8;
  pointer pvStack_1d0;
  pointer pvStack_1c8;
  pointer pvStack_1c0;
  pointer pvStack_1b8;
  element_type *peStack_1b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1a8 [3];
  Matrix3d local_190;
  NoncentralAbsoluteMultiAdapter local_148;
  
  opengv::initializeRandomSeed();
  opengv::generateRandomTranslation(&local_278,2.0);
  opengv::generateRandomRotation(&local_190,0.5);
  local_340.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_340.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_340.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_360.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_360.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_360.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateRandomCameraSystem(4,&local_340,&local_360);
  local_2f0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_310.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_310.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a0.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a0.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a0.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateMulti2D3DCorrespondences
            (&local_278,&local_190,&local_340,&local_360,0x19,0.5,0.1,&local_2f0,&local_310,
             &local_2a0);
  opengv::printExperimentCharacteristics(&local_278,&local_190,0.5,0.1);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(&local_2b8,&local_310);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(&local_2d0,&local_2f0);
  opengv::absolute_pose::NoncentralAbsoluteMultiAdapter::NoncentralAbsoluteMultiAdapter
            (&local_148,&local_2b8,&local_2d0,&local_340,&local_360);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_2d0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_2b8);
  local_260._8_4_ = 1000;
  local_260._16_8_ = 1.0;
  local_260._24_8_ = 0.99;
  local_1e0 = (pointer)0x0;
  pvStack_1d8 = (pointer)0x0;
  pvStack_1d0 = (pointer)0x0;
  pvStack_1c8 = (pointer)0x0;
  pvStack_1c0 = (pointer)0x0;
  pvStack_1b8 = (pointer)0x0;
  peStack_1b0 = (element_type *)0x0;
  a_Stack_1a8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_260._0_8_ = &PTR__MultiSampleConsensus_0020ea68;
  this = (MultiNoncentralAbsolutePoseSacProblem *)operator_new(0x13f0);
  opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem::
  MultiNoncentralAbsolutePoseSacProblem(this,&local_148.super_AbsoluteMultiAdapterBase,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem*>
            (&local_368,this);
  peStack_1b0 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_1a8,&local_368);
  local_260._16_8_ = 3.9062477108497973e-07;
  local_260._8_4_ = 0x32;
  gettimeofday(&local_320,(__timezone_ptr_t)0x0);
  opengv::sac::
  MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  computeModel((MultiRansac<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
                *)local_260,0);
  gettimeofday(&local_288,(__timezone_ptr_t)0x0);
  tVar21 = timeval_minus((timeval *)&local_288,(timeval *)&local_320);
  tVar22 = timeval_minus((timeval *)&local_288,(timeval *)&local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the ransac results is: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  poVar3 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)(local_260 + 0x20))
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ransac needed ",0xe);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_260._12_4_);
  uVar18 = extraout_XMM0_Qb;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," iterations and ",0x10);
  auVar19._0_8_ = (double)tVar21.tv_sec;
  auVar19._8_8_ = uVar18;
  auVar17._0_8_ = (double)tVar22.tv_usec;
  auVar17._8_8_ = uVar18;
  auVar17 = vfmadd132sd_fma(auVar17,auVar19,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar3 = std::ostream::_M_insert<double>(auVar17._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if ((long)pvStack_1c0 - (long)pvStack_1c8 != 0) {
    lVar7 = ((long)pvStack_1c0 - (long)pvStack_1c8 >> 3) * -0x5555555555555555;
    uVar6 = lVar7 + (ulong)(lVar7 == 0) + 7 & 0xfffffffffffffff8;
    auVar10 = vpbroadcastq_avx512f();
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar13 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      auVar14 = vmovdqa64_avx512f(auVar20);
      uVar8 = vpcmpuq_avx512f(auVar11,auVar10,2);
      vpmullq_avx512dq(auVar11,auVar12);
      auVar20 = vpgatherqq_avx512f(*(undefined8 *)
                                    (&stack0x00000000 +
                                    (long)&pvStack_1c8->
                                           super__Vector_base<int,_std::allocator<int>_>));
      bVar1 = (byte)uVar8;
      auVar15._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar20._8_8_;
      auVar15._0_8_ = (ulong)(bVar1 & 1) * auVar20._0_8_;
      auVar15._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar20._16_8_;
      auVar15._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar20._24_8_;
      auVar15._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar20._32_8_;
      auVar15._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar20._40_8_;
      auVar15._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar20._48_8_;
      auVar15._56_8_ = (uVar8 >> 7) * auVar20._56_8_;
      auVar20 = vpgatherqq_avx512f(*(undefined8 *)
                                    (&stack0xfffffffffffffff8 +
                                    (long)&pvStack_1c8->
                                           super__Vector_base<int,_std::allocator<int>_>));
      auVar16._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar20._8_8_;
      auVar16._0_8_ = (ulong)(bVar1 & 1) * auVar20._0_8_;
      auVar16._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar20._16_8_;
      auVar16._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar20._24_8_;
      auVar16._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar20._32_8_;
      auVar16._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar20._40_8_;
      auVar16._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar20._48_8_;
      auVar16._56_8_ = (uVar8 >> 7) * auVar20._56_8_;
      auVar20 = vpsubq_avx512f(auVar15,auVar16);
      auVar20 = vpsraq_avx512f(auVar20,2);
      auVar20 = vpaddq_avx512f(auVar20,auVar14);
      auVar11 = vpaddq_avx512f(auVar11,auVar13);
      uVar6 = uVar6 - 8;
    } while (uVar6 != 0);
    auVar10 = vmovdqa64_avx512f(auVar20);
    auVar11._0_8_ = (ulong)(bVar1 & 1) * auVar10._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar14._0_8_;
    bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar11._8_8_ = (ulong)bVar2 * auVar10._8_8_ | (ulong)!bVar2 * auVar14._8_8_;
    bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar11._16_8_ = (ulong)bVar2 * auVar10._16_8_ | (ulong)!bVar2 * auVar14._16_8_;
    bVar2 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar11._24_8_ = (ulong)bVar2 * auVar10._24_8_ | (ulong)!bVar2 * auVar14._24_8_;
    bVar2 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar11._32_8_ = (ulong)bVar2 * auVar10._32_8_ | (ulong)!bVar2 * auVar14._32_8_;
    bVar2 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar11._40_8_ = (ulong)bVar2 * auVar10._40_8_ | (ulong)!bVar2 * auVar14._40_8_;
    bVar2 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar11._48_8_ = (ulong)bVar2 * auVar10._48_8_ | (ulong)!bVar2 * auVar14._48_8_;
    auVar11._56_8_ = (uVar8 >> 7) * auVar10._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar14._56_8_;
    auVar9 = vextracti64x4_avx512f(auVar11,1);
    auVar10 = vpaddq_avx512f(auVar11,ZEXT3264(auVar9));
    auVar17 = vpaddq_avx(auVar10._0_16_,auVar10._16_16_);
    auVar19 = vpshufd_avx(auVar17,0xee);
    vpaddq_avx(auVar17,auVar19);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the number of inliers is: ",0x1a);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the found inliers are: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  if (pvStack_1c0 != pvStack_1c8) {
    uVar6 = 0;
    do {
      piVar5 = pvStack_1c8[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvStack_1c8[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar5) {
        uVar8 = 0;
        do {
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar5[uVar8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          uVar8 = uVar8 + 1;
          piVar5 = pvStack_1c8[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)pvStack_1c8[uVar6].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(((long)pvStack_1c0 - (long)pvStack_1c8 >> 3) * -0x5555555555555555));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  opengv::sac::
  MultiSampleConsensus<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>::
  ~MultiSampleConsensus
            ((MultiSampleConsensus<opengv::sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem>
              *)local_260);
  opengv::absolute_pose::NoncentralAbsoluteMultiAdapter::~NoncentralAbsoluteMultiAdapter(&local_148)
  ;
  std::
  vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::~vector(&local_2a0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_310);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_2f0);
  if (local_360.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_360.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8]);
  }
  if (local_340.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_340.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.5;
  double outlierFraction = 0.1;
  size_t pointsPerCam = 25;
  int numberCameras = 4;

  //create a random viewpoint pose
  translation_t position = generateRandomTranslation(2.0);
  rotation_t rotation = generateRandomRotation(0.5);

  //create a random camera-system
  translations_t camOffsets;
  rotations_t camRotations;
  generateRandomCameraSystem( numberCameras, camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  std::vector<std::shared_ptr<points_t> > multiPoints;
  std::vector<std::shared_ptr<bearingVectors_t> > multiBearingVectors;
  std::vector< std::shared_ptr<Eigen::MatrixXd> > gt;
  generateMulti2D3DCorrespondences(
      position, rotation, camOffsets, camRotations,
      pointsPerCam, noise, outlierFraction,
      multiPoints, multiBearingVectors, gt );

  //print the experiment characteristics
  printExperimentCharacteristics(
      position, rotation, noise, outlierFraction );

  //create a non-central absolute adapter
  absolute_pose::NoncentralAbsoluteMultiAdapter adapter(
      multiBearingVectors,
      multiPoints,
      camOffsets,
      camRotations );

  //Create a AbsolutePoseSacProblem and Ransac
  //The method is set to GP3P
  sac::MultiRansac<
      sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem> ransac;
  std::shared_ptr<
      sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem> absposeproblem_ptr(
      new sac_problems::absolute_pose::MultiNoncentralAbsolutePoseSacProblem(
      adapter ));

  ransac.sac_model_ = absposeproblem_ptr;
  ransac.threshold_ = 1.0 - cos(atan(sqrt(2.0)*0.5/800.0));
  ransac.max_iterations_ = 50;

  //Run the experiment
  struct timeval tic;
  struct timeval toc;
  gettimeofday( &tic, 0 );
  ransac.computeModel();
  gettimeofday( &toc, 0 );
  double ransac_time = TIMETODOUBLE(timeval_minus(toc,tic));

  //print the results
  std::cout << "the ransac results is: " << std::endl;
  std::cout << ransac.model_coefficients_ << std::endl << std::endl;
  std::cout << "Ransac needed " << ransac.iterations_ << " iterations and ";
  std::cout << ransac_time << " seconds" << std::endl << std::endl;
  size_t numberInliers = 0;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
    numberInliers += ransac.inliers_[i].size();
  std::cout << "the number of inliers is: " << numberInliers;
  std::cout << std::endl << std::endl;
  std::cout << "the found inliers are: " << std::endl;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
  {
    for(size_t j = 0; j < ransac.inliers_[i].size(); j++)
      std::cout << ransac.inliers_[i][j] << " ";
  }
  std::cout << std::endl << std::endl;
}